

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

void __thiscall QObjectPrivate::~QObjectPrivate(QObjectPrivate *this)

{
  QThreadData *this_00;
  __pointer_type pQVar1;
  long lVar2;
  TimerId *pTVar3;
  QDynamicMetaObjectData *pQVar4;
  ExtraData *this_01;
  Data *pDVar5;
  Data *pDVar6;
  QThread *pQVar7;
  long lVar8;
  long in_FS_OFFSET;
  QMessageLogger local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QObjectData)._vptr_QObjectData = (_func_int **)&PTR__QObjectPrivate_0069b138;
  this_00 = (this->threadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p;
  if ((this->extraData != (ExtraData *)0x0) && ((this->extraData->runningTimers).d.size != 0)) {
    pQVar1 = (this_00->thread).super_QBasicAtomicPointer<QThread>._q_value._M_b._M_p;
    pQVar7 = QThread::currentThread();
    if (pQVar7 == pQVar1) {
      if ((this_00->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value.
          _M_b._M_p != (__pointer_type)0x0) {
        (*(((this_00->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value.
            _M_b._M_p)->super_QObject)._vptr_QObject[0x11])();
      }
      lVar2 = (this->extraData->runningTimers).d.size;
      if (lVar2 != 0) {
        pTVar3 = (this->extraData->runningTimers).d.ptr;
        lVar8 = 0;
        do {
          QAbstractEventDispatcherPrivate::releaseTimerId(*(int *)((long)pTVar3 + lVar8));
          lVar8 = lVar8 + 4;
        } while (lVar2 << 2 != lVar8);
      }
    }
    else {
      local_50.context.version = 2;
      local_50.context._4_8_ = 0;
      local_50.context._12_8_ = 0;
      local_50.context.function._4_4_ = 0;
      local_50.context.category = "default";
      QMessageLogger::warning
                (&local_50,"QObject::~QObject: Timers cannot be stopped from another thread");
    }
  }
  if ((this->super_QObjectData).postedEvents.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 0) {
    QCoreApplication::removePostedEvents((this->super_QObjectData).q_ptr,0);
  }
  QThreadData::deref(this_00);
  pQVar4 = (this->super_QObjectData).metaObject;
  if (pQVar4 != (QDynamicMetaObjectData *)0x0) {
    (*pQVar4->_vptr_QDynamicMetaObjectData[2])(pQVar4,(this->super_QObjectData).q_ptr);
  }
  this_01 = this->extraData;
  if (this_01 != (ExtraData *)0x0) {
    pDVar5 = (this_01->objectName).super_QPropertyData<QString>.val.d.d;
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value =
           (Type)((int)(pDVar5->super_QArrayData).ref_._q_value + -1);
      UNLOCK();
      if ((__atomic_base<int>)*(__int_type_conflict *)&(pDVar5->super_QArrayData).ref_._q_value ==
          (__atomic_base<int>)0x0) {
        QArrayData::deallocate
                  (&((this_01->objectName).super_QPropertyData<QString>.val.d.d)->super_QArrayData,2
                   ,0x10);
      }
    }
    QArrayDataPointer<QPointer<QObject>_>::~QArrayDataPointer(&(this_01->eventFilters).d);
    pDVar6 = (this_01->runningTimers).d.d;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((this_01->runningTimers).d.d)->super_QArrayData,4,0x10);
      }
    }
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&(this_01->propertyValues).d);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)this_01);
  }
  operator_delete(this_01,0x80);
  QObjectData::~QObjectData(&this->super_QObjectData);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QObjectPrivate::~QObjectPrivate()
{
    auto thisThreadData = threadData.loadRelaxed();
    if (extraData && !extraData->runningTimers.isEmpty()) {
        if (Q_LIKELY(thisThreadData->thread.loadAcquire() == QThread::currentThread())) {
            // unregister pending timers
            if (thisThreadData->hasEventDispatcher())
                thisThreadData->eventDispatcher.loadRelaxed()->unregisterTimers(q_ptr);

            // release the timer ids back to the pool
            for (auto id : std::as_const(extraData->runningTimers))
                QAbstractEventDispatcherPrivate::releaseTimerId(id);
        } else {
            qWarning("QObject::~QObject: Timers cannot be stopped from another thread");
        }
    }

    if (postedEvents.loadRelaxed())
        QCoreApplication::removePostedEvents(q_ptr, 0);

    thisThreadData->deref();

    if (metaObject)
        metaObject->objectDestroyed(q_ptr);

    delete extraData;
}